

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>::
rehash(Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
       *this,size_t sizeHint)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  quintptr qVar7;
  QAbstractItemModel *pQVar8;
  Mapping *pMVar9;
  Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*> *pNVar10;
  ulong uVar11;
  Span *pSVar12;
  size_t index;
  long lVar13;
  size_t numBuckets;
  long lVar14;
  long in_FS_OFFSET;
  R_conflict7 RVar15;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if (0x40 < sizeHint) {
    if (sizeHint >> 0x3e == 0) {
      lVar13 = 0x3f;
      if (sizeHint != 0) {
        for (; sizeHint >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar13 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  uVar3 = this->numBuckets;
  pSVar4 = this->spans;
  RVar15 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar15.spans;
  this->numBuckets = numBuckets;
  pSVar12 = pSVar4;
  for (uVar11 = 0; uVar11 != uVar3 >> 7; uVar11 = uVar11 + 1) {
    for (lVar13 = 0; lVar13 != 0x80; lVar13 = lVar13 + 1) {
      bVar2 = pSVar12->offsets[lVar13];
      if (bVar2 != 0xff) {
        pEVar5 = pSVar4[uVar11].entries;
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<QtPrivate::QModelIndexWrapper>
                             (this,(QModelIndexWrapper *)(pEVar5 + bVar2));
        pNVar10 = Bucket::insert(&local_48);
        uVar6 = *(undefined8 *)pEVar5[bVar2].storage.data;
        qVar7 = *(quintptr *)(pEVar5[bVar2].storage.data + 8);
        puVar1 = pEVar5[bVar2].storage.data + 0x10;
        pQVar8 = *(QAbstractItemModel **)puVar1;
        pMVar9 = *(Mapping **)(puVar1 + 8);
        (pNVar10->key).index.r = (int)uVar6;
        (pNVar10->key).index.c = (int)((ulong)uVar6 >> 0x20);
        (pNVar10->key).index.i = qVar7;
        (pNVar10->key).index.m.ptr = pQVar8;
        pNVar10->value = pMVar9;
      }
    }
    Span<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
    ::freeData(pSVar4 + uVar11);
    pSVar12 = pSVar12 + 1;
  }
  if (pSVar4 != (Span *)0x0) {
    lVar13 = *(long *)&pSVar4[-1].allocated;
    if (lVar13 != 0) {
      lVar14 = lVar13 * 0x90;
      do {
        Span<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
        ::freeData((Span<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    *)(pSVar4[-1].offsets + lVar14));
        lVar14 = lVar14 + -0x90;
      } while (lVar14 != 0);
    }
    operator_delete__(&pSVar4[-1].allocated,lVar13 * 0x90 | 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }